

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall JetHead::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  Path *pPVar1;
  char *pcVar2;
  int iVar3;
  DIR *pDVar4;
  uint uVar5;
  uint uVar6;
  char *__s;
  long lVar7;
  bool bVar8;
  dirent *dir_ptr;
  dirent dir;
  dirent *local_158;
  int local_14c;
  dirent local_148;
  
  if (this->mDirHandle != (void *)0x0) {
    return 0;
  }
  pDVar4 = opendir(*(char **)__file);
  this->mDirHandle = pDVar4;
  if ((this->mData).mAllocated < 0x32) {
    vector<JetHead::Path>::sizeup(&this->mData,0x32);
  }
  local_158 = &local_148;
  lVar7 = 0;
  uVar6 = 0;
  do {
    iVar3 = readdir_r((DIR *)this->mDirHandle,&local_148,&local_158);
    local_14c = CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0);
    if (iVar3 != 0) {
      return local_14c;
    }
    uVar5 = uVar6;
    if (local_158 == (dirent *)0x0) goto LAB_00117c2d;
    __s = local_158->d_name;
    pPVar1 = (this->mData).mData;
    pcVar2 = *(char **)((long)&(pPVar1->mPath)._M_string_length + lVar7);
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((long)&(pPVar1->mPath)._M_dataplus._M_p + lVar7,0,pcVar2,(ulong)__s);
    uVar5 = uVar6 + 1;
  } while ((local_158 != (dirent *)0x0) &&
          (lVar7 = lVar7 + 0x20, bVar8 = uVar6 < 0x31, uVar6 = uVar5, bVar8));
  if (local_158 == (dirent *)0x0) {
LAB_00117c2d:
    this->mNumberEntries = uVar5 + 1;
  }
  return local_14c;
}

Assistant:

bool Directory::open( const Path &p )
{
	if ( mDirHandle != NULL )
		return false;

	mDirHandle = opendir( p.getString().c_str() );

	mData.reserve( gNumberEntries );

	struct dirent dir;
	struct dirent *dir_ptr = &dir;
	int i = 0;

	// fill with the first gNumberEntries files.  This is done to keep this
	//  from taking too much time if the directory has 1000's of files.
	while ( dir_ptr != NULL && i < gNumberEntries )
	{
		if ( readdir_r( DIR_HANDLE, &dir, &dir_ptr ) != 0 )
			return false;

		if ( dir_ptr != NULL )
		{
			mData[ i ] = dir_ptr->d_name;
			i += 1;
		}
	}

	if ( dir_ptr == NULL )
		mNumberEntries = i + 1;

	return true;
}